

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  secp256k1_scratch_space *scratch;
  ulong extraout_RAX;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long extraout_RDX;
  secp256k1_gej *scratch_00;
  size_t len;
  long extraout_RDX_00;
  secp256k1_gej *r;
  secp256k1_ge *psVar12;
  secp256k1_strauss_point_state *psVar13;
  byte *out32;
  ulong uVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_ge *psVar18;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *psVar19;
  secp256k1_ge *psVar20;
  uint64_t *puVar21;
  code *cb;
  secp256k1_scalar **cbdata;
  secp256k1_scalar **ppsVar22;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *hash_00;
  secp256k1_callback *error_callback;
  long lVar23;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar24;
  byte bVar25;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  size_t sStack_3950;
  secp256k1_scalar *psStack_3938;
  secp256k1_ge *psStack_3930;
  ulong uStack_3928;
  ulong uStack_3920;
  ulong uStack_3918;
  ulong uStack_3910;
  ulong uStack_3908;
  ulong uStack_3900;
  ulong uStack_38f8;
  secp256k1_scalar sStack_38f0;
  secp256k1_scalar sStack_38d0;
  secp256k1_strauss_state sStack_38b0;
  secp256k1_gej sStack_3898;
  undefined1 auStack_3800 [152];
  secp256k1_gej sStack_3768;
  secp256k1_gej sStack_36d0;
  secp256k1_scalar sStack_3638;
  secp256k1_scalar sStack_3618;
  secp256k1_scalar sStack_35f8;
  secp256k1_scalar sStack_35d8;
  secp256k1_scalar asStack_35b8 [28];
  secp256k1_scalar sStack_3238;
  secp256k1_scalar sStack_3218;
  secp256k1_gej sStack_31f8;
  secp256k1_gej sStack_3160;
  secp256k1_fe asStack_30c8 [8];
  secp256k1_ge asStack_2f48 [8];
  secp256k1_ge sStack_2c00;
  secp256k1_strauss_point_state sStack_2b98;
  secp256k1_ge sStack_2788;
  secp256k1_ge asStack_2720 [31];
  secp256k1_gej *psStack_1a80;
  secp256k1_callback *psStack_1a78;
  secp256k1_gej *psStack_1a68;
  secp256k1_strauss_point_state *psStack_1a60;
  secp256k1_scalar *psStack_1a58;
  secp256k1_gej *psStack_1a50;
  undefined1 auStack_1a38 [8];
  undefined1 auStack_1a30 [176];
  secp256k1_gej sStack_1980;
  secp256k1_gej sStack_18e8;
  secp256k1_gej sStack_1850;
  secp256k1_gej sStack_17b8;
  secp256k1_gej sStack_1720;
  secp256k1_gej asStack_1688 [2];
  secp256k1_gej asStack_1508 [5];
  secp256k1_strauss_point_state sStack_11c8;
  secp256k1_scratch_space *psStack_db0;
  secp256k1_sha256 *psStack_da8;
  secp256k1_gej *psStack_da0;
  secp256k1_scalar *psStack_d98;
  secp256k1_gej *psStack_d90;
  code *pcStack_d88;
  undefined4 uStack_d7e;
  undefined2 uStack_d7a;
  long lStack_d78;
  byte abStack_d70 [32];
  secp256k1_scalar sStack_d50;
  secp256k1_sha256 sStack_d30;
  undefined1 auStack_cc0 [144];
  secp256k1_strauss_point_state *psStack_c30;
  undefined1 auStack_c28 [32];
  undefined1 local_c08 [40];
  secp256k1_ge *local_be0;
  secp256k1_strauss_point_state *local_bd8;
  secp256k1_gej local_bd0;
  secp256k1_gej local_b38;
  secp256k1_gej local_aa0;
  secp256k1_ge local_a08;
  secp256k1_gej local_9a0;
  secp256k1_fe local_908 [8];
  secp256k1_ge local_788 [8];
  secp256k1_strauss_point_state local_448;
  
  bVar25 = 0;
  psVar17 = (secp256k1_gej *)auStack_c28;
  psVar13 = (secp256k1_strauss_point_state *)(ulong)(uint)mode;
  psVar24 = (secp256k1_scalar *)local_c08;
  psStack_c30 = (secp256k1_strauss_point_state *)0x157c65;
  testutil_random_scalar_order_test(psVar24);
  psStack_c30 = (secp256k1_strauss_point_state *)0x157c76;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c28,psVar24,target);
  psStack_c30 = (secp256k1_strauss_point_state *)0x157c81;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c28,(secp256k1_scalar *)auStack_c28);
  if (mode == 0) {
    psStack_c30 = (secp256k1_strauss_point_state *)0x157d7a;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_aa0,(secp256k1_scalar *)local_c08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x157d91;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_b38,(secp256k1_scalar *)auStack_c28);
    psStack_c30 = (secp256k1_strauss_point_state *)0x157da5;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_bd0,target);
  }
  else {
    psStack_c30 = (secp256k1_strauss_point_state *)0x157c99;
    testutil_random_ge_test(&local_a08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x157ca9;
    secp256k1_gej_set_ge(&local_9a0,&local_a08);
    if (mode == 1) {
      unaff_R12 = local_908;
      unaff_R13 = local_788;
      psVar13 = &local_448;
      psVar24 = &secp256k1_scalar_zero;
      psStack_c30 = (secp256k1_strauss_point_state *)0x157d09;
      local_b38.x.n[0] = (uint64_t)unaff_R12;
      local_b38.x.n[1] = (uint64_t)unaff_R13;
      local_b38.x.n[2] = (uint64_t)psVar13;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_b38,&local_aa0,1,&local_9a0,
                 (secp256k1_scalar *)local_c08,&secp256k1_scalar_zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x157d34;
      local_bd0.x.n[0] = (uint64_t)unaff_R12;
      local_bd0.x.n[1] = (uint64_t)unaff_R13;
      local_bd0.x.n[2] = (uint64_t)psVar13;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_bd0,&local_b38,1,&local_9a0,
                 (secp256k1_scalar *)auStack_c28,&secp256k1_scalar_zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x157d5c;
      local_c08._32_8_ = unaff_R12;
      local_be0 = unaff_R13;
      local_bd8 = psVar13;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(local_c08 + 0x20),&local_bd0,1,&local_9a0,target,
                 &secp256k1_scalar_zero);
      psVar17 = &local_9a0;
    }
    else {
      psVar24 = (secp256k1_scalar *)&local_a08;
      psStack_c30 = (secp256k1_strauss_point_state *)0x157dc4;
      secp256k1_ecmult_const(&local_aa0,(secp256k1_ge *)psVar24,(secp256k1_scalar *)local_c08);
      psStack_c30 = (secp256k1_strauss_point_state *)0x157dd7;
      secp256k1_ecmult_const(&local_b38,(secp256k1_ge *)psVar24,(secp256k1_scalar *)auStack_c28);
      psStack_c30 = (secp256k1_strauss_point_state *)0x157de7;
      secp256k1_ecmult_const(&local_bd0,(secp256k1_ge *)psVar24,target);
      psVar17 = (secp256k1_gej *)auStack_c28;
    }
  }
  psStack_c30 = (secp256k1_strauss_point_state *)0x157e01;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_aa0,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x157e16;
  psVar15 = &local_bd0;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_b38,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x157e1e;
  psVar16 = &local_bd0;
  secp256k1_gej_verify(&local_bd0);
  if (local_bd0.infinity != 0) {
    return;
  }
  psStack_c30 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (byte *)((ulong)psVar16 & 0xffffffff);
  pcStack_d88 = (code *)0x157e6a;
  lStack_d78 = extraout_RDX;
  auStack_cc0._104_8_ = &local_bd0;
  auStack_cc0._112_8_ = unaff_R12;
  auStack_cc0._120_8_ = unaff_R13;
  auStack_cc0._128_8_ = psVar24;
  auStack_cc0._136_8_ = psVar17;
  psStack_c30 = psVar13;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_d7e = SUB84(psVar16,0);
  psVar17 = (secp256k1_gej *)auStack_cc0;
  auStack_cc0._0_8_ = 0xbb67ae856a09e667;
  auStack_cc0._8_8_ = 0xa54ff53a3c6ef372;
  auStack_cc0._16_8_ = 0x9b05688c510e527f;
  auStack_cc0._24_8_ = 0x5be0cd191f83d9ab;
  hash_00 = (secp256k1_sha256 *)0x0;
  auStack_cc0._96_8_ = 0;
  sStack_d50.d[0] = 0;
  sStack_d50.d[1] = 0;
  sStack_d50.d[2] = 0;
  sStack_d50.d[3] = 0;
  pcStack_d88 = (code *)0x157eb1;
  secp256k1_scalar_verify(&sStack_d50);
  pcStack_d88 = (code *)0x157ebf;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar17,&sStack_d50,scratch);
  sStack_d50.d[0] = 1;
  sStack_d50.d[1] = 0;
  sStack_d50.d[2] = 0;
  sStack_d50.d[3] = 0;
  pcStack_d88 = (code *)0x157eda;
  secp256k1_scalar_verify(&sStack_d50);
  pcStack_d88 = (code *)0x157ee8;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar17,&sStack_d50,scratch);
  pcStack_d88 = (code *)0x157ef3;
  secp256k1_scalar_negate(&sStack_d50,&sStack_d50);
  pcStack_d88 = (code *)0x157f01;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar17,&sStack_d50,scratch);
  if (psVar15 != (secp256k1_gej *)0x0) {
    psVar17 = (secp256k1_gej *)0x0;
    hash_00 = &sStack_d30;
    out32 = abStack_d70;
    do {
      uStack_d7a = SUB82(psVar17,0);
      sStack_d30.s[0] = 0x6a09e667;
      sStack_d30.s[1] = 0xbb67ae85;
      sStack_d30.s[2] = 0x3c6ef372;
      sStack_d30.s[3] = 0xa54ff53a;
      sStack_d30.s[4] = 0x510e527f;
      sStack_d30.s[5] = 0x9b05688c;
      sStack_d30.s[6] = 0x1f83d9ab;
      sStack_d30.s[7] = 0x5be0cd19;
      sStack_d30.bytes = 0;
      pcStack_d88 = (code *)0x157f58;
      secp256k1_sha256_write(hash_00,(uchar *)&uStack_d7e,6);
      pcStack_d88 = (code *)0x157f63;
      secp256k1_sha256_finalize(hash_00,out32);
      pcStack_d88 = (code *)0x157f70;
      secp256k1_scalar_set_b32(&sStack_d50,out32,(int *)0x0);
      pcStack_d88 = (code *)0x157f83;
      test_ecmult_accumulate((secp256k1_sha256 *)auStack_cc0,&sStack_d50,scratch);
      psVar17 = (secp256k1_gej *)((long)(psVar17->x).n + 1);
    } while (psVar15 != psVar17);
  }
  pcStack_d88 = (code *)0x157f9d;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_cc0,abStack_d70);
  lVar10 = 0;
  uVar9 = extraout_RAX;
  do {
    uVar14 = uVar9 & 0xffffffff;
    bVar1 = abStack_d70[lVar10];
    psVar16 = (secp256k1_gej *)(ulong)bVar1;
    bVar2 = *(byte *)(lStack_d78 + lVar10);
    hash = (secp256k1_sha256 *)(ulong)bVar2;
    uVar9 = (ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      uVar9 = uVar14;
    }
    iVar6 = (int)uVar9;
    if (bVar1 != bVar2) goto LAB_00157fc7;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x20);
  iVar6 = 0;
LAB_00157fc7:
  if (iVar6 == 0) {
    pcStack_d88 = (code *)0x157fda;
    secp256k1_scratch_space_destroy(CTX,scratch);
    return;
  }
  pcStack_d88 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  auStack_1a38 = (undefined1  [8])0x41;
  psStack_1a50 = (secp256k1_gej *)0x15802a;
  psStack_db0 = scratch;
  psStack_da8 = hash_00;
  psStack_da0 = psVar17;
  psStack_d98 = &sStack_d50;
  psStack_d90 = psVar15;
  pcStack_d88 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1850,&secp256k1_ge_const_g);
  psStack_1a50 = (secp256k1_gej *)0x158037;
  secp256k1_gej_set_infinity(&sStack_18e8);
  psStack_1a50 = (secp256k1_gej *)0x15804e;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_17b8 + 1,(secp256k1_scalar *)psVar16);
  psVar13 = (secp256k1_strauss_point_state *)(asStack_1508[5].y.n + 3);
  psStack_1a50 = (secp256k1_gej *)0x1580a0;
  sStack_1980.x.n[0] = (uint64_t)asStack_1688;
  sStack_1980.x.n[1] = (uint64_t)asStack_1508;
  sStack_1980.x.n[2] = (uint64_t)psVar13;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1980,&sStack_17b8,1,&sStack_1850,
             (secp256k1_scalar *)psVar16,&secp256k1_scalar_zero);
  psStack_1a50 = (secp256k1_gej *)0x1580d0;
  auStack_1a30._0_8_ = asStack_1688;
  auStack_1a30._8_8_ = asStack_1508;
  auStack_1a30._16_8_ = psVar13;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1a30,&sStack_1980,1,&sStack_18e8,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar16);
  error_callback = (secp256k1_callback *)0xd0;
  psVar15 = (secp256k1_gej *)&CTX->error_callback;
  psStack_1a50 = (secp256k1_gej *)0x158101;
  psVar24 = (secp256k1_scalar *)psVar16;
  psVar17 = scratch_00;
  iVar6 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar15,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1508[5].y.n + 3),(secp256k1_scalar *)psVar16,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar6 == 0) {
    psStack_1a50 = (secp256k1_gej *)0x158264;
    test_ecmult_accumulate_cold_8();
LAB_00158264:
    psStack_1a50 = (secp256k1_gej *)0x158269;
    test_ecmult_accumulate_cold_7();
LAB_00158269:
    psStack_1a50 = (secp256k1_gej *)0x15826e;
    test_ecmult_accumulate_cold_6();
LAB_0015826e:
    psStack_1a50 = (secp256k1_gej *)0x158273;
    test_ecmult_accumulate_cold_5();
LAB_00158273:
    psStack_1a50 = (secp256k1_gej *)0x158278;
    test_ecmult_accumulate_cold_4();
LAB_00158278:
    psStack_1a50 = (secp256k1_gej *)0x15827d;
    test_ecmult_accumulate_cold_3();
LAB_0015827d:
    psStack_1a50 = (secp256k1_gej *)0x158282;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar24 = &secp256k1_scalar_zero;
    psStack_1a50 = (secp256k1_gej *)0x15813c;
    psVar17 = scratch_00;
    psVar15 = (secp256k1_gej *)error_callback;
    iVar6 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1508,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar16,1);
    if (iVar6 == 0) goto LAB_00158264;
    psStack_1a50 = (secp256k1_gej *)0x15815b;
    secp256k1_ecmult_const(asStack_1688,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar16);
    psVar16 = (secp256k1_gej *)auStack_1a30;
    psStack_1a50 = (secp256k1_gej *)0x158170;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar16,&sStack_17b8 + 1);
    psVar15 = &sStack_17b8;
    psStack_1a50 = (secp256k1_gej *)0x158180;
    psVar17 = psVar16;
    iVar6 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar16);
    if (iVar6 == 0) goto LAB_00158269;
    psVar15 = &sStack_1980;
    psVar17 = (secp256k1_gej *)auStack_1a30;
    psStack_1a50 = (secp256k1_gej *)0x15819a;
    iVar6 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar17);
    if (iVar6 == 0) goto LAB_0015826e;
    psVar15 = (secp256k1_gej *)(asStack_1508[5].y.n + 3);
    psVar17 = (secp256k1_gej *)auStack_1a30;
    psStack_1a50 = (secp256k1_gej *)0x1581b4;
    iVar6 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar17);
    if (iVar6 == 0) goto LAB_00158273;
    psVar15 = asStack_1508;
    psVar17 = (secp256k1_gej *)auStack_1a30;
    psStack_1a50 = (secp256k1_gej *)0x1581ce;
    iVar6 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar17);
    if (iVar6 == 0) goto LAB_00158278;
    psVar15 = asStack_1688;
    psVar17 = (secp256k1_gej *)auStack_1a30;
    psStack_1a50 = (secp256k1_gej *)0x1581e8;
    iVar6 = secp256k1_gej_eq_ge_var(psVar15,(secp256k1_ge *)psVar17);
    if (iVar6 == 0) goto LAB_0015827d;
    psStack_1a50 = (secp256k1_gej *)0x1581fd;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1a30);
    if (auStack_1a30._96_4_ != 0) {
      auStack_1a30[0x68] = 0;
      len = 1;
LAB_00158243:
      psStack_1a50 = (secp256k1_gej *)0x15824d;
      secp256k1_sha256_write(hash,auStack_1a30 + 0x68,len);
      return;
    }
    psVar15 = (secp256k1_gej *)auStack_1a30;
    psVar17 = (secp256k1_gej *)(auStack_1a30 + 0x68);
    psVar16 = (secp256k1_gej *)auStack_1a38;
    psVar24 = (secp256k1_scalar *)0x0;
    psStack_1a50 = (secp256k1_gej *)0x158232;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar15,(uchar *)psVar17,(size_t *)psVar16,0);
    if (auStack_1a38 == (undefined1  [8])0x41) {
      len = 0x41;
      goto LAB_00158243;
    }
  }
  psStack_1a50 = (secp256k1_gej *)test_ecmult_accumulate_cb;
  test_ecmult_accumulate_cold_1();
  uVar3 = (((secp256k1_gej *)psVar24)->x).n[0];
  uVar4 = (((secp256k1_gej *)psVar24)->x).n[1];
  uVar5 = (((secp256k1_gej *)psVar24)->x).n[3];
  (psVar15->x).n[2] = (((secp256k1_gej *)psVar24)->x).n[2];
  (psVar15->x).n[3] = uVar5;
  (psVar15->x).n[0] = uVar3;
  (psVar15->x).n[1] = uVar4;
  psVar18 = &secp256k1_ge_const_g;
  psVar15 = psVar17;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    (psVar15->x).n[0] = (psVar18->x).n[0];
    psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar25 * -0x10 + 8);
    psVar15 = (secp256k1_gej *)((long)psVar15 + (ulong)bVar25 * -0x10 + 8);
  }
  if (extraout_RDX_00 == 0) {
    return;
  }
  psStack_1a58 = (secp256k1_scalar *)test_ecmult_multi;
  psStack_1a50 = psVar17;
  test_ecmult_accumulate_cb_cold_1();
  psStack_1a58 = &secp256k1_scalar_zero;
  psStack_3938 = &sStack_3638;
  cbdata = &psStack_3938;
  psStack_3930 = &sStack_2788;
  psVar19 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar24 = (secp256k1_scalar *)0x0;
  psVar17 = psVar15;
  psStack_1a80 = asStack_1688;
  psStack_1a78 = error_callback;
  psStack_1a68 = psVar16;
  psStack_1a60 = psVar13;
  iVar6 = (*(code *)psVar18)(psVar19,psVar15,auStack_3800);
  if (iVar6 == 0) goto LAB_00159301;
  if (0 < COUNT) {
    iVar6 = 0;
    do {
      uStack_3928 = CONCAT44(uStack_3928._4_4_,iVar6);
      testutil_random_scalar_order(&sStack_3638);
      testutil_random_scalar_order(&sStack_3618);
      testutil_random_ge_test((secp256k1_ge *)&sStack_31f8);
      secp256k1_gej_set_ge(&sStack_3768,(secp256k1_ge *)&sStack_31f8);
      sStack_3898.x.n[1] = (uint64_t)asStack_2f48;
      psVar17 = &sStack_31f8;
      psVar12 = &sStack_2788;
      for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
        (psVar12->x).n[0] = (psVar17->x).n[0];
        psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar25 * -0x10 + 8);
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      psVar12 = &secp256k1_ge_const_g;
      psVar20 = asStack_2720;
      for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
        (psVar20->x).n[0] = (psVar12->x).n[0];
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar25 * -2 + 1) * 8);
        psVar20 = (secp256k1_ge *)((long)psVar20 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      psVar16 = &sStack_3160;
      psVar24 = &sStack_3638;
      sStack_3898.x.n[0] = (uint64_t)asStack_30c8;
      sStack_3898.x.n[2] = (uint64_t)&sStack_2b98;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3898,psVar16,1,&sStack_3768,
                 &secp256k1_scalar_zero,psVar24);
      psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      ppsVar22 = &psStack_3938;
      psVar17 = psVar15;
      iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
      if (iVar6 == 0) goto LAB_001592b6;
      psVar17 = psVar16;
      psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
      iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3800,psVar16);
      if (iVar6 == 0) goto LAB_001592bb;
      sStack_3898.x.n[1] = (uint64_t)asStack_2f48;
      sStack_3898.x.n[0] = (uint64_t)asStack_30c8;
      sStack_3898.x.n[2] = (uint64_t)&sStack_2b98;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3898,psVar16,1,&sStack_3768,&sStack_3638,
                 &secp256k1_scalar_zero);
      psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar24 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &psStack_3938;
      psVar17 = psVar15;
      ppsVar22 = cbdata;
      iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
      if (iVar6 == 0) goto LAB_001592c0;
      psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
      iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3800,psVar16);
      if (iVar6 == 0) goto LAB_001592c5;
      psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar24 = &secp256k1_scalar_zero;
      cb = ecmult_multi_false_callback;
      psVar16 = psVar15;
      ppsVar22 = cbdata;
      iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
      if (iVar6 != 0) goto LAB_001592ca;
      sStack_3898.x.n[0] = (uint64_t)asStack_30c8;
      sStack_3898.x.n[1] = (uint64_t)asStack_2f48;
      sStack_3898.x.n[2] = (uint64_t)&sStack_2b98;
      psVar17 = &sStack_3160;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3898,psVar17,1,&sStack_3768,&sStack_3638,
                 &sStack_3618);
      psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar24 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar16 = psVar15;
      iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
      if (iVar6 == 0) goto LAB_001592cf;
      psVar16 = psVar17;
      psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
      iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3800,psVar17);
      if (iVar6 == 0) goto LAB_001592d4;
      sStack_3898.x.n[0] = (uint64_t)asStack_30c8;
      sStack_3898.x.n[1] = (uint64_t)asStack_2f48;
      sStack_3898.x.n[2] = (uint64_t)&sStack_2b98;
      psVar24 = &sStack_3618;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3898,psVar17,1,&sStack_3768,&sStack_3638,psVar24
                );
      psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cbdata = &psStack_3938;
      cb = ecmult_multi_callback;
      psVar16 = psVar15;
      iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
      if (iVar6 == 0) goto LAB_001592d9;
      psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
      iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3800,psVar17);
      if (iVar6 == 0) goto LAB_001592de;
      iVar6 = (int)uStack_3928 + 1;
    } while (iVar6 < COUNT);
  }
  if (0 < COUNT) {
    uVar9 = 0;
    do {
      lVar10 = 0;
      uStack_3928 = uVar9;
      do {
        psVar12 = &sStack_2788;
        lVar23 = 0;
        do {
          testutil_random_scalar_order((secp256k1_scalar *)((long)sStack_3638.d + lVar23));
          secp256k1_ge_set_infinity(psVar12);
          lVar23 = lVar23 + 0x20;
          psVar12 = psVar12 + 1;
        } while (lVar23 != 0x400);
        psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar24 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar22 = &psStack_3938;
        psVar17 = psVar15;
        iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
        if (iVar6 == 0) goto LAB_0015928e;
        psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
        secp256k1_gej_verify((secp256k1_gej *)auStack_3800);
        if (auStack_3800._144_4_ == 0) goto LAB_00159293;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar10 = 0;
      do {
        psVar24 = &sStack_3638;
        lVar23 = 0;
        do {
          testutil_random_ge_test((secp256k1_ge *)&sStack_2b98);
          psVar13 = &sStack_2b98;
          puVar21 = (uint64_t *)((long)sStack_2788.x.n + lVar23);
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar21 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar25 * -0x10 + 8);
            puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
          }
          psVar24->d[2] = 0;
          psVar24->d[3] = 0;
          psVar24->d[0] = 0;
          psVar24->d[1] = 0;
          secp256k1_scalar_verify(psVar24);
          lVar23 = lVar23 + 0x68;
          psVar24 = psVar24 + 1;
        } while (lVar23 != 0xd00);
        psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar24 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar22 = &psStack_3938;
        psVar17 = psVar15;
        iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
        if (iVar6 == 0) goto LAB_00159298;
        psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
        secp256k1_gej_verify((secp256k1_gej *)auStack_3800);
        if (auStack_3800._144_4_ == 0) goto LAB_0015929d;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar10 = 0;
      do {
        testutil_random_ge_test((secp256k1_ge *)&sStack_2b98);
        lVar23 = 0x68;
        psVar24 = &sStack_3638;
        do {
          testutil_random_scalar_order(psVar24);
          secp256k1_scalar_negate(psVar24 + 1,psVar24);
          psVar13 = &sStack_2b98;
          puVar21 = (uint64_t *)((long)(&sStack_2788)[-1].x.n + lVar23);
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar21 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar25 * -0x10 + 8);
            puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
          }
          psVar13 = &sStack_2b98;
          puVar21 = (uint64_t *)((long)sStack_2788.x.n + lVar23);
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar21 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar25 * -0x10 + 8);
            puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
          }
          lVar23 = lVar23 + 0xd0;
          psVar24 = psVar24 + 2;
        } while (lVar23 != 0xd68);
        psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar24 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar22 = &psStack_3938;
        psVar17 = psVar15;
        iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
        if (iVar6 == 0) goto LAB_001592a2;
        psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
        secp256k1_gej_verify((secp256k1_gej *)auStack_3800);
        if (auStack_3800._144_4_ == 0) goto LAB_001592a7;
        testutil_random_scalar_order(&sStack_3638);
        lVar23 = 0x20;
        psVar12 = &sStack_2788;
        do {
          testutil_random_ge_test((secp256k1_ge *)&sStack_2b98);
          uVar4 = sStack_3638.d[3];
          uVar3 = sStack_3638.d[1];
          *(uint64_t *)((long)sStack_36d0.z.n + lVar23 + 0x28) = sStack_3638.d[2];
          *(uint64_t *)((long)(&sStack_36d0.z + 1) + lVar23) = uVar4;
          *(uint64_t *)((long)sStack_36d0.z.n + lVar23 + 0x18) = sStack_3638.d[0];
          *(uint64_t *)((long)sStack_36d0.z.n + lVar23 + 0x20) = uVar3;
          *(uint64_t *)((long)sStack_3638.d + lVar23) = sStack_3638.d[0];
          *(uint64_t *)((long)sStack_3638.d + lVar23 + 8) = sStack_3638.d[1];
          *(uint64_t *)((long)sStack_3638.d + lVar23 + 0x10) = sStack_3638.d[2];
          *(uint64_t *)((long)sStack_3638.d + lVar23 + 0x18) = sStack_3638.d[3];
          psVar13 = &sStack_2b98;
          psVar20 = psVar12;
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar20->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar25 * -0x10 + 8);
            psVar20 = (secp256k1_ge *)((long)psVar20 + (ulong)bVar25 * -0x10 + 8);
          }
          secp256k1_ge_neg(psVar12 + 1,psVar12);
          lVar23 = lVar23 + 0x40;
          psVar12 = psVar12 + 2;
        } while (lVar23 != 0x420);
        psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar24 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar22 = &psStack_3938;
        psVar17 = psVar15;
        iVar6 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
        if (iVar6 == 0) goto LAB_001592ac;
        psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
        secp256k1_gej_verify((secp256k1_gej *)auStack_3800);
        if (auStack_3800._144_4_ == 0) goto LAB_001592b1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      testutil_random_ge_test((secp256k1_ge *)&sStack_2b98);
      sStack_3638.d[2] = 0;
      sStack_3638.d[3] = 0;
      sStack_3638.d[0] = 0;
      sStack_3638.d[1] = 0;
      secp256k1_scalar_verify(&sStack_3638);
      psVar13 = &sStack_2b98;
      psVar12 = &sStack_2788;
      for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
        (psVar12->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
        psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar25 * -0x10 + 8);
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      lVar10 = 0x68;
      psVar24 = &sStack_3618;
      do {
        psVar13 = &sStack_2b98;
        puVar21 = (uint64_t *)((long)sStack_2788.x.n + lVar10);
        for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
          *puVar21 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
          psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar25 * -0x10 + 8);
          puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
        }
        testutil_random_scalar_order(psVar24);
        secp256k1_scalar_add(&sStack_3638,&sStack_3638,psVar24);
        secp256k1_scalar_negate(psVar24,psVar24);
        lVar10 = lVar10 + 0x68;
        psVar24 = psVar24 + 1;
      } while (lVar10 != 0xd00);
      psVar19 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar24 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &psStack_3938;
      psVar17 = psVar15;
      iVar6 = (*(code *)psVar18)(psVar19,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
      if (iVar6 == 0) goto LAB_001592f7;
      psVar19 = (secp256k1_strauss_point_state *)auStack_3800;
      secp256k1_gej_verify((secp256k1_gej *)auStack_3800);
      if (auStack_3800._144_4_ == 0) goto LAB_001592fc;
      uVar7 = (int)uStack_3928 + 1;
      uVar9 = (ulong)uVar7;
    } while ((int)uVar7 < COUNT);
  }
  if (0 < COUNT) {
    iVar6 = 0;
    do {
      secp256k1_gej_set_infinity((secp256k1_gej *)auStack_3800);
      testutil_random_scalar_order(&sStack_3638);
      psVar12 = &sStack_2788;
      lVar10 = 0;
      do {
        uVar5 = sStack_3638.d[3];
        uVar4 = sStack_3638.d[2];
        uVar3 = sStack_3638.d[1];
        *(uint64_t *)((long)sStack_3638.d + lVar10) = sStack_3638.d[0];
        *(uint64_t *)((long)sStack_3638.d + lVar10 + 8) = uVar3;
        *(uint64_t *)((long)sStack_3638.d + lVar10 + 0x10) = uVar4;
        *(uint64_t *)((long)sStack_3638.d + lVar10 + 0x18) = uVar5;
        testutil_random_ge_test((secp256k1_ge *)&sStack_2b98);
        psVar13 = &sStack_2b98;
        psVar20 = psVar12;
        for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
          (psVar20->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
          psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar25 * -0x10 + 8);
          psVar20 = (secp256k1_ge *)((long)psVar20 + (ulong)bVar25 * -0x10 + 8);
        }
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)auStack_3800,(secp256k1_gej *)auStack_3800,psVar12,
                   (secp256k1_fe *)0x0);
        lVar10 = lVar10 + 0x20;
        psVar12 = psVar12 + 1;
      } while (lVar10 != 0x280);
      sStack_3768.x.n[0] = (uint64_t)asStack_30c8;
      sStack_3768.x.n[1] = (uint64_t)asStack_2f48;
      sStack_3768.x.n[2] = (uint64_t)&sStack_2b98;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_3768,&sStack_3160,1,
                 (secp256k1_gej *)auStack_3800,&sStack_3638,&secp256k1_scalar_zero);
      psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar24 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &psStack_3938;
      psVar17 = psVar15;
      iVar8 = (*(code *)psVar18)(psVar13,psVar15,(secp256k1_strauss_point_state *)auStack_3800);
      if (iVar8 == 0) goto LAB_001592e3;
      psVar17 = &sStack_3160;
      psVar13 = (secp256k1_strauss_point_state *)auStack_3800;
      iVar8 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3800,&sStack_3160);
      if (iVar8 == 0) goto LAB_001592e8;
      iVar6 = iVar6 + 1;
    } while (iVar6 < COUNT);
  }
  if (0 < COUNT) {
    iVar6 = 0;
    do {
      sStack_3898.x.n[2] = 0;
      sStack_3898.x.n[3] = 0;
      sStack_3898.x.n[0] = 0;
      sStack_3898.x.n[1] = 0;
      secp256k1_scalar_verify((secp256k1_scalar *)&sStack_3898);
      testutil_random_ge_test((secp256k1_ge *)&sStack_31f8);
      psVar24 = &sStack_3638;
      lVar10 = 0;
      do {
        testutil_random_scalar_order(psVar24);
        psVar17 = &sStack_31f8;
        puVar21 = (uint64_t *)((long)sStack_2788.x.n + lVar10);
        for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
          *puVar21 = (psVar17->x).n[0];
          psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar25 * -0x10 + 8);
          puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
        }
        secp256k1_scalar_add
                  ((secp256k1_scalar *)&sStack_3898,(secp256k1_scalar *)&sStack_3898,psVar24);
        lVar10 = lVar10 + 0x68;
        psVar24 = psVar24 + 1;
      } while (lVar10 != 0x820);
      secp256k1_gej_set_ge(&sStack_3768,&sStack_2788);
      sStack_36d0.x.n[0] = (uint64_t)asStack_30c8;
      sStack_36d0.x.n[1] = (uint64_t)asStack_2f48;
      sStack_36d0.x.n[2] = (uint64_t)&sStack_2b98;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_36d0,&sStack_3160,1,&sStack_3768,
                 (secp256k1_scalar *)&sStack_3898,&secp256k1_scalar_zero);
      psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar19 = (secp256k1_strauss_point_state *)auStack_3800;
      psVar24 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &psStack_3938;
      psVar17 = psVar15;
      iVar8 = (*(code *)psVar18)(psVar13,psVar15,psVar19);
      if (iVar8 == 0) goto LAB_001592ed;
      psVar17 = &sStack_3160;
      iVar8 = secp256k1_gej_eq_var((secp256k1_gej *)psVar19,&sStack_3160);
      if (iVar8 == 0) goto LAB_001592f2;
      iVar6 = iVar6 + 1;
    } while (iVar6 < COUNT);
  }
  lVar10 = 0;
  psVar12 = &sStack_2788;
  do {
    testutil_random_scalar_order((secp256k1_scalar *)((long)sStack_3638.d + lVar10));
    testutil_random_ge_test(psVar12);
    psVar12 = psVar12 + 1;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x280);
  sStack_3638.d[2] = 0;
  sStack_3638.d[3] = 0;
  sStack_3638.d[0] = 0;
  sStack_3638.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3638);
  psVar19 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar24 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3938;
  psVar17 = psVar15;
  iVar6 = (*(code *)psVar18)(psVar19,psVar15,auStack_3800);
  if (iVar6 == 0) goto LAB_00159306;
  sStack_3618.d[2] = 0;
  sStack_3618.d[3] = 0;
  sStack_3618.d[0] = 0;
  sStack_3618.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3618);
  sStack_35f8.d[2] = 0;
  sStack_35f8.d[3] = 0;
  sStack_35f8.d[0] = 0;
  sStack_35f8.d[1] = 0;
  secp256k1_scalar_verify(&sStack_35f8);
  sStack_35d8.d[2] = 0;
  sStack_35d8.d[3] = 0;
  sStack_35d8.d[0] = 0;
  sStack_35d8.d[1] = 0;
  secp256k1_scalar_verify(&sStack_35d8);
  asStack_35b8[0].d[2] = 0;
  asStack_35b8[0].d[3] = 0;
  asStack_35b8[0].d[0] = 0;
  asStack_35b8[0].d[1] = 0;
  secp256k1_scalar_verify(asStack_35b8);
  psVar19 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar24 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3938;
  psVar17 = psVar15;
  iVar6 = (*(code *)psVar18)(psVar19,psVar15,auStack_3800);
  if (iVar6 == 0) goto LAB_0015930b;
  psVar19 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar24 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3938;
  psVar17 = psVar15;
  iVar6 = (*(code *)psVar18)(psVar19,psVar15,auStack_3800);
  if (iVar6 != 0) {
    psVar19 = (secp256k1_strauss_point_state *)auStack_3800;
    secp256k1_gej_verify((secp256k1_gej *)psVar19);
    if (auStack_3800._144_4_ != 0) {
      testutil_random_ge_test(&sStack_2c00);
      secp256k1_gej_set_ge(&sStack_3768,&sStack_2c00);
      uStack_3920 = 0;
      do {
        uStack_3918 = uStack_3920 + 1 >> 1;
        uStack_3910 = (ulong)((uint)uStack_3920 & 1);
        uVar9 = 0;
        uStack_3920 = uStack_3920 + 1;
        do {
          uVar14 = uStack_3910;
          sStack_38d0.d[3] = 0;
          sStack_38d0.d[1] = 0;
          sStack_38d0.d[2] = 0;
          sStack_38d0.d[0] = uStack_3918;
          secp256k1_scalar_verify(&sStack_38d0);
          secp256k1_scalar_cond_negate(&sStack_38d0,(int)uVar14);
          uStack_3908 = uVar9 + 1;
          sStack_38f0.d[0] = uStack_3908 >> 1;
          sStack_38f0.d[1] = 0;
          sStack_38f0.d[2] = 0;
          sStack_38f0.d[3] = 0;
          secp256k1_scalar_verify(&sStack_38f0);
          secp256k1_scalar_cond_negate(&sStack_38f0,(uint)uVar9 & 1);
          sStack_3898.x.n[0] = (uint64_t)asStack_30c8;
          sStack_3898.x.n[1] = (uint64_t)asStack_2f48;
          sStack_3898.x.n[2] = (uint64_t)&sStack_2b98;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&sStack_3898,&sStack_31f8,1,&sStack_3768,
                     &sStack_38d0,&secp256k1_scalar_zero);
          sStack_36d0.x.n[0] = (uint64_t)asStack_30c8;
          sStack_36d0.x.n[1] = (uint64_t)asStack_2f48;
          sStack_36d0.x.n[2] = (uint64_t)&sStack_2b98;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&sStack_36d0,&sStack_3898,1,&sStack_3768,
                     &sStack_38f0,&secp256k1_scalar_zero);
          uStack_3900 = 0;
          do {
            uStack_38f8 = uStack_3900 + 1 >> 1;
            uStack_3928 = (ulong)((uint)uStack_3900 & 1);
            uVar9 = 0;
            uStack_3900 = uStack_3900 + 1;
            do {
              secp256k1_ge_set_gej(&sStack_2788,&sStack_31f8);
              secp256k1_ge_set_gej(asStack_2720,&sStack_3898);
              sStack_3638.d[0] = uStack_38f8;
              sStack_3638.d[3] = 0;
              sStack_3638.d[1] = 0;
              sStack_3638.d[2] = 0;
              secp256k1_scalar_verify(&sStack_3638);
              secp256k1_scalar_cond_negate(&sStack_3638,(int)uStack_3928);
              uVar14 = uVar9 + 1;
              sStack_3618.d[0] = uVar14 >> 1;
              sStack_3618.d[1] = 0;
              sStack_3618.d[2] = 0;
              sStack_3618.d[3] = 0;
              secp256k1_scalar_verify(&sStack_3618);
              psVar16 = &sStack_36d0;
              secp256k1_scalar_cond_negate(&sStack_3618,(uint)uVar9 & 1);
              secp256k1_scalar_mul(&sStack_3218,&sStack_38d0,&sStack_3638);
              secp256k1_scalar_mul(&sStack_3238,&sStack_38f0,&sStack_3618);
              secp256k1_scalar_add(&sStack_3218,&sStack_3218,&sStack_3238);
              sStack_38b0.aux = asStack_30c8;
              sStack_38b0.pre_a = asStack_2f48;
              psVar19 = &sStack_2b98;
              sStack_38b0.ps = psVar19;
              secp256k1_ecmult_strauss_wnaf
                        (&sStack_38b0,psVar16,1,&sStack_3768,&sStack_3218,&secp256k1_scalar_zero);
              psVar13 = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar24 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              ppsVar22 = &psStack_3938;
              psVar17 = psVar15;
              iVar6 = (*(code *)psVar18)(psVar13,psVar15,psVar19);
              if (iVar6 == 0) {
                test_ecmult_multi_cold_3();
LAB_00159289:
                test_ecmult_multi_cold_2();
                goto LAB_0015928e;
              }
              iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)psVar19,psVar16);
              psVar17 = psVar16;
              psVar13 = psVar19;
              if (iVar6 == 0) goto LAB_00159289;
              uVar9 = uVar14;
            } while (uVar14 != 8);
          } while (uStack_3900 != 8);
          uVar9 = uStack_3908;
        } while (uStack_3908 != 8);
        if (uStack_3920 == 8) {
          return;
        }
      } while( true );
    }
    goto LAB_00159315;
  }
  goto LAB_00159310;
LAB_0015928e:
  test_ecmult_multi_cold_21();
LAB_00159293:
  test_ecmult_multi_cold_20();
LAB_00159298:
  test_ecmult_multi_cold_19();
LAB_0015929d:
  test_ecmult_multi_cold_18();
LAB_001592a2:
  test_ecmult_multi_cold_17();
LAB_001592a7:
  test_ecmult_multi_cold_16();
LAB_001592ac:
  test_ecmult_multi_cold_15();
LAB_001592b1:
  test_ecmult_multi_cold_14();
LAB_001592b6:
  test_ecmult_multi_cold_29();
LAB_001592bb:
  test_ecmult_multi_cold_28();
LAB_001592c0:
  psVar16 = psVar17;
  test_ecmult_multi_cold_27();
LAB_001592c5:
  test_ecmult_multi_cold_26();
LAB_001592ca:
  cbdata = ppsVar22;
  test_ecmult_multi_cold_1();
LAB_001592cf:
  test_ecmult_multi_cold_25();
LAB_001592d4:
  test_ecmult_multi_cold_24();
LAB_001592d9:
  psVar17 = psVar16;
  test_ecmult_multi_cold_23();
LAB_001592de:
  test_ecmult_multi_cold_22();
LAB_001592e3:
  test_ecmult_multi_cold_11();
LAB_001592e8:
  test_ecmult_multi_cold_10();
LAB_001592ed:
  psVar19 = psVar13;
  test_ecmult_multi_cold_9();
LAB_001592f2:
  test_ecmult_multi_cold_8();
LAB_001592f7:
  test_ecmult_multi_cold_13();
LAB_001592fc:
  test_ecmult_multi_cold_12();
LAB_00159301:
  test_ecmult_multi_cold_30();
LAB_00159306:
  test_ecmult_multi_cold_7();
LAB_0015930b:
  test_ecmult_multi_cold_6();
LAB_00159310:
  test_ecmult_multi_cold_5();
LAB_00159315:
  test_ecmult_multi_cold_4();
  secp256k1_ecmult_pippenger_batch
            ((secp256k1_callback *)psVar19,(secp256k1_scratch *)psVar17,r,psVar24,cb,cbdata,
             sStack_3950,0);
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;

    /* Generate random n1,n2 such that n1+n2 = -target. */
    testutil_random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        testutil_random_ge_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &secp256k1_scalar_zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &secp256k1_scalar_zero);
        secp256k1_ecmult(&ptj, &pj, target, &secp256k1_scalar_zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}